

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::EmitScopeObjectInit(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ParseNodeFnc *this_00;
  ParseNode *this_01;
  code *pcVar1;
  anon_class_24_3_78f89b5c fn;
  anon_class_32_4_e369621f fn_00;
  anon_class_16_2_43e5d7e0 fn_01;
  uint32 size;
  PropertyId count;
  bool bVar2;
  byte bVar3;
  byte extraSlots;
  uint uVar4;
  ScopeType SVar5;
  FunctionBody *pFVar6;
  Symbol *pSVar7;
  Scope *pSVar8;
  Scope *pSVar9;
  ParseNodeVar *pPVar10;
  CharacterBuffer<char16_t> *key;
  undefined4 *puVar11;
  charcount_t *pcVar12;
  PropertyId *slots;
  ParseNodeBlock *pnodeBlock;
  Symbol *sym_1;
  ParseNode *pnode;
  anon_class_32_4_e369621f saveFunctionVarsToPropIdArray;
  Symbol *sym;
  ParseNodePtr rest;
  anon_class_24_3_78f89b5c initArg;
  PropertyId slot;
  ParseNodeFnc *pnodeFnc;
  PropertyIdArray *propIds;
  PropertyId local_30;
  uint extraAlloc;
  PropertyId firstVarSlot;
  PropertyId firstFuncSlot;
  uint cachedFuncCount;
  uint slotCount;
  Scope *currentScope;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  currentScope = (Scope *)funcInfo;
  funcInfo_local = (FuncInfo *)this;
  pFVar6 = Js::FunctionProxy::GetFunctionBody(&funcInfo->byteCodeFunction->super_FunctionProxy);
  bVar2 = Js::ParseableFunctionInfo::DoStackNestedFunc(&pFVar6->super_ParseableFunctionInfo);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x627,
                       "(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc())",
                       "!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar2 = FuncInfo::GetHasCachedScope((FuncInfo *)currentScope);
  if (bVar2) {
    _cachedFuncCount = FuncInfo::GetCurrentChildScope((FuncInfo *)currentScope);
    uVar4 = Scope::GetScopeSlotCount(_cachedFuncCount);
    firstVarSlot = 0;
    extraAlloc = 0xffffffff;
    local_30 = -1;
    firstFuncSlot = uVar4;
    bVar3 = Js::ActivationObjectEx::ExtraSlotCount();
    propIds._4_4_ = UInt32Math::Add(uVar4,(uint)bVar3);
    propIds._4_4_ = UInt32Math::Mul(propIds._4_4_,4);
    pFVar6 = FuncInfo::GetParsedFunctionBody((FuncInfo *)currentScope);
    count = firstFuncSlot;
    size = propIds._4_4_;
    extraSlots = Js::ActivationObjectEx::ExtraSlotCount();
    pnodeFnc = (ParseNodeFnc *)
               Js::FunctionBody::AllocatePropertyIdArrayForFormals(pFVar6,size,count,extraSlots);
    this_00 = *(ParseNodeFnc **)&currentScope[6].scopeSlotCount;
    bVar2 = FuncInfo::GetFuncExprNameReference((FuncInfo *)currentScope);
    if (bVar2) {
      pSVar7 = ParseNodeFnc::GetFuncSymbol(this_00);
      pSVar8 = Symbol::GetScope(pSVar7);
      pSVar9 = FuncInfo::GetBodyScope((FuncInfo *)currentScope);
      if (pSVar8 == pSVar9) {
        pSVar7 = ParseNodeFnc::GetFuncSymbol(this_00);
        Symbol::SaveToPropIdArray(pSVar7,(PropertyIdArray *)pnodeFnc,this,(PropertyId *)0x0);
      }
    }
    bVar2 = FuncInfo::GetHasArguments((FuncInfo *)currentScope);
    if (bVar2) {
      initArg.this._4_4_ = 0;
      initArg.slot = (PropertyId *)&pnodeFnc;
      fn.propIds = (PropertyIdArray **)initArg.slot;
      fn.slot = (PropertyId *)((long)&initArg.this + 4);
      fn.this = this;
      initArg.propIds = (PropertyIdArray **)this;
      MapFormalsWithoutRest<ByteCodeGenerator::EmitScopeObjectInit(FuncInfo*)::__0>(this_00,fn);
      this_01 = this_00->pnodeRest;
      if ((this_01 != (ParseNode *)0x0) && (bVar2 = ParseNode::IsVarLetOrConst(this_01), bVar2)) {
        pPVar10 = ParseNode::AsParseNodeVar(this_01);
        pSVar7 = pPVar10->sym;
        bVar2 = Symbol::IsInSlot(pSVar7,this,(FuncInfo *)currentScope,false);
        if (bVar2) {
          Symbol::SaveToPropIdArray(pSVar7,(PropertyIdArray *)pnodeFnc,this,(PropertyId *)0x0);
        }
      }
    }
    else {
      fn_01.this = this;
      fn_01.propIds = (PropertyIdArray **)&pnodeFnc;
      MapFormals<ByteCodeGenerator::EmitScopeObjectInit(FuncInfo*)::__1>(this_00,fn_01);
    }
    fn_00.this = this;
    fn_00.propIds = (PropertyIdArray **)&pnodeFnc;
    fn_00.firstFuncSlot = (PropertyId *)&extraAlloc;
    fn_00.cachedFuncCount = (uint *)&firstVarSlot;
    MapContainerScopeFunctions<ByteCodeGenerator::EmitScopeObjectInit(FuncInfo*)::__2>
              (&this_00->super_ParseNode,fn_00);
    SVar5 = Scope::GetScopeType(_cachedFuncCount);
    if (SVar5 == ScopeType_Parameter) {
      bVar2 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)currentScope);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x6bc,"(!funcInfo->IsBodyAndParamScopeMerged())",
                           "!funcInfo->IsBodyAndParamScopeMerged()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
    else {
      sym_1 = (Symbol *)this_00->pnodeVars;
      while (sym_1 != (Symbol *)0x0) {
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
        pnodeBlock = (ParseNodeBlock *)pPVar10->sym;
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
        if ((pPVar10->isBlockScopeFncDeclVar == '\0') ||
           (bVar2 = Symbol::GetIsBlockVar((Symbol *)pnodeBlock), !bVar2)) {
          bVar2 = Symbol::GetIsCatch((Symbol *)pnodeBlock);
          if ((bVar2) ||
             ((*(char *)&(sym_1->name).string.ptr == 'Q' &&
              (bVar2 = Symbol::GetIsBlockVar((Symbol *)pnodeBlock), bVar2)))) {
            pSVar8 = _cachedFuncCount;
            key = Symbol::GetName((Symbol *)pnodeBlock);
            pnodeBlock = (ParseNodeBlock *)Scope::FindLocalSymbol(pSVar8,key);
          }
          Symbol::SaveToPropIdArray((Symbol *)pnodeBlock,(PropertyIdArray *)pnodeFnc,this,&local_30)
          ;
        }
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
        sym_1 = (Symbol *)pPVar10->pnodeNext;
      }
      sym_1 = (Symbol *)this_00->pnodeScopes->pnodeLexVars;
      while (sym_1 != (Symbol *)0x0) {
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
        Symbol::SaveToPropIdArray(pPVar10->sym,(PropertyIdArray *)pnodeFnc,this,&local_30);
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
        sym_1 = (Symbol *)pPVar10->pnodeNext;
      }
      sym_1 = (Symbol *)this_00->pnodeBodyScope->pnodeLexVars;
      while (sym_1 != (Symbol *)0x0) {
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
        Symbol::SaveToPropIdArray(pPVar10->sym,(PropertyIdArray *)pnodeFnc,this,&local_30);
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
        sym_1 = (Symbol *)pPVar10->pnodeNext;
      }
    }
    pcVar12 = &(pnodeFnc->super_ParseNode).ichLim + (uint)firstFuncSlot;
    *pcVar12 = firstVarSlot;
    pcVar12[1] = extraAlloc;
    pcVar12[2] = local_30;
    pFVar6 = FuncInfo::GetParsedFunctionBody((FuncInfo *)currentScope);
    uVar4 = Js::FunctionBody::NewObjectLiteral(pFVar6);
    pcVar12[3] = uVar4;
    bVar2 = ParseNodeFnc::HasNonSimpleParameterList
                      (*(ParseNodeFnc **)&currentScope[6].scopeSlotCount);
    *(bool *)((long)&(pnodeFnc->super_ParseNode).ichMin + 3) = bVar2;
    pFVar6 = FuncInfo::GetParsedFunctionBody((FuncInfo *)currentScope);
    Js::FunctionBody::SetHasCachedScopePropIds(pFVar6,true);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitScopeObjectInit(FuncInfo *funcInfo)
{
    Assert(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc());

    if (!funcInfo->GetHasCachedScope() /* || forcing scope/inner func caching */)
    {
        return;
    }

    Scope* currentScope = funcInfo->GetCurrentChildScope();
    uint slotCount = currentScope->GetScopeSlotCount();
    uint cachedFuncCount = 0;
    Js::PropertyId firstFuncSlot = Js::Constants::NoProperty;
    Js::PropertyId firstVarSlot = Js::Constants::NoProperty;

    uint extraAlloc = UInt32Math::Add(slotCount, Js::ActivationObjectEx::ExtraSlotCount());
    extraAlloc = UInt32Math::Mul(extraAlloc, sizeof(Js::PropertyId));

    // Create and fill the array of local property ID's.
    // They all have slots assigned to them already (if they need them): see StartEmitFunction.

    Js::PropertyIdArray *propIds = funcInfo->GetParsedFunctionBody()->AllocatePropertyIdArrayForFormals(extraAlloc, slotCount, Js::ActivationObjectEx::ExtraSlotCount());

    ParseNodeFnc *pnodeFnc = funcInfo->root;

    if (funcInfo->GetFuncExprNameReference() && pnodeFnc->GetFuncSymbol()->GetScope() == funcInfo->GetBodyScope())
    {
        Symbol::SaveToPropIdArray(pnodeFnc->GetFuncSymbol(), propIds, this);
    }

    if (funcInfo->GetHasArguments())
    {
        // Because the arguments object can access all instances of same-named formals ("function(x,x){...}"),
        // be sure we initialize any duplicate appearances of a formal parameter to "NoProperty".
        Js::PropertyId slot = 0;
        auto initArg = [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol *sym = pnode->AsParseNodeVar()->sym;
                Assert(sym);
                if (sym->GetScopeSlot() == slot)
                {
                    // This is the last appearance of the formal, so record the ID.
                    Symbol::SaveToPropIdArray(sym, propIds, this);
                }
                else
                {
                    // This is an earlier duplicate appearance of the formal, so use NoProperty as a placeholder
                    // since this slot can't be accessed by name.
                    Assert(sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot);
                    propIds->elements[slot] = Js::Constants::NoProperty;
                }
            }
            else
            {
                // This is for patterns
                propIds->elements[slot] = Js::Constants::NoProperty;
            }
            slot++;
        };
        MapFormalsWithoutRest(pnodeFnc, initArg);

        ParseNodePtr rest = pnodeFnc->pnodeRest;
        if (rest != nullptr && rest->IsVarLetOrConst())
        {
            // If the rest is in the slot - we need to keep that slot.
            Symbol *sym = rest->AsParseNodeVar()->sym;
            if (sym->IsInSlot(this, funcInfo))
            {
                Symbol::SaveToPropIdArray(sym, propIds, this);
            }
        }
    }
    else
    {
        MapFormals(pnodeFnc, [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol::SaveToPropIdArray(pnode->AsParseNodeVar()->sym, propIds, this);
            }
        });
    }

    auto saveFunctionVarsToPropIdArray = [&](ParseNode *pnodeFunction)
    {
        if (pnodeFunction->AsParseNodeFnc()->IsDeclaration())
        {
            ParseNode *pnodeName = pnodeFunction->AsParseNodeFnc()->pnodeName;
            if (pnodeName != nullptr)
            {
                while (pnodeName->nop == knopList)
                {
                    if (pnodeName->AsParseNodeBin()->pnode1->nop == knopVarDecl)
                    {
                        Symbol *sym = pnodeName->AsParseNodeBin()->pnode1->AsParseNodeVar()->sym;
                        if (sym)
                        {
                            Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        }
                    }
                    pnodeName = pnodeName->AsParseNodeBin()->pnode2;
                }
                if (pnodeName->nop == knopVarDecl)
                {
                    Symbol *sym = pnodeName->AsParseNodeVar()->sym;
                    if (sym)
                    {
                        Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        cachedFuncCount++;
                    }
                }
            }
        }
    };
    MapContainerScopeFunctions(pnodeFnc, saveFunctionVarsToPropIdArray);

    if (currentScope->GetScopeType() != ScopeType_Parameter)
    {
        ParseNode *pnode;
        Symbol *sym;
        for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
            {
                if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                {
                    sym = currentScope->FindLocalSymbol(sym->GetName());
                }
                Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
            }
        }

        ParseNodeBlock *pnodeBlock = pnodeFnc->pnodeScopes;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }

        pnodeBlock = pnodeFnc->pnodeBodyScope;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }
    }
    else
    {
        Assert(!funcInfo->IsBodyAndParamScopeMerged());
    }

    // Write the first func slot and first var slot into the auxiliary data
    Js::PropertyId *slots = propIds->elements + slotCount;
    slots[0] = cachedFuncCount;
    slots[1] = firstFuncSlot;
    slots[2] = firstVarSlot;
    slots[3] = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

    propIds->hasNonSimpleParams = funcInfo->root->HasNonSimpleParameterList();

    funcInfo->GetParsedFunctionBody()->SetHasCachedScopePropIds(true);
}